

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

float core::image::desaturate_lightness<float>(float *v)

{
  float *v1;
  float *v2;
  float fVar1;
  float *min;
  float *max;
  float *v_local;
  
  v1 = std::max_element<float_const*>(v,v + 3);
  v2 = std::min_element<float_const*>(v,v + 3);
  fVar1 = math::interpolate<float>(v1,v2,0.5,0.5);
  return fVar1;
}

Assistant:

inline T
desaturate_lightness (T const* v)
{
    T const* max = std::max_element(v, v + 3);
    T const* min = std::min_element(v, v + 3);
    return math::interpolate(*max, *min, 0.5f, 0.5f);
}